

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_slb.c
# Opt level: O3

void * SLB_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *arc;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint32 count;
  PHYSFS_uint32 tocPos;
  PHYSFS_uint32 version;
  PHYSFS_uint32 local_24;
  PHYSFS_uint32 local_20;
  PHYSFS_uint32 local_1c;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs_archiver_slb.c"
                  ,0x4d,"void *SLB_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&local_1c,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    local_1c = PHYSFS_swapULE32(local_1c);
    if (local_1c == 0) {
      iVar1 = __PHYSFS_readAll(io,&local_24,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      local_24 = PHYSFS_swapULE32(local_24);
      if (local_24 != 0) {
        iVar1 = __PHYSFS_readAll(io,&local_20,4);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        local_20 = PHYSFS_swapULE32(local_20);
        if (local_20 != 0) {
          iVar1 = (*io->seek)(io,(PHYSFS_uint64)local_20);
          if (iVar1 == 0) {
            return (void *)0x0;
          }
          arc = UNPK_openArchive(io);
          if (arc == (void *)0x0) {
            return (void *)0x0;
          }
          iVar1 = slbLoadEntries(io,local_24,arc);
          if (iVar1 == 0) {
            UNPK_abandonArchive(arc);
            return (void *)0x0;
          }
          *claimed = 1;
          return arc;
        }
      }
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *SLB_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint32 version;
    PHYSFS_uint32 count;
    PHYSFS_uint32 tocPos;
    void *unpkarc;

    /* There's no identifier on an SLB file, so we assume it's _not_ if the
       file count or tocPos is zero. Beyond that, we'll assume it's
       bogus/corrupt if the entries' filenames don't start with '\' or the
       tocPos is past the end of the file (seek will fail). This probably
       covers all meaningful cases where we would accidentally accept a non-SLB
       file with this archiver. */

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &version, sizeof (version)), NULL);
    version = PHYSFS_swapULE32(version);
    BAIL_IF(version != 0, PHYSFS_ERR_UNSUPPORTED, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE32(count);
    BAIL_IF(!count, PHYSFS_ERR_UNSUPPORTED, NULL);

    /* offset of the table of contents */
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &tocPos, sizeof (tocPos)), NULL);
    tocPos = PHYSFS_swapULE32(tocPos);
    BAIL_IF(!tocPos, PHYSFS_ERR_UNSUPPORTED, NULL);
    
    /* seek to the table of contents */
    BAIL_IF_ERRPASS(!io->seek(io, tocPos), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!slbLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    *claimed = 1;  /* oh well. */

    return unpkarc;
}